

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.h
# Opt level: O0

void __thiscall
Generic_Command_As_Console_Command<PartGenericCommand>::Generic_Command_As_Console_Command
          (Generic_Command_As_Console_Command<PartGenericCommand> *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  long local_18;
  size_t index;
  Generic_Command_As_Console_Command<PartGenericCommand> *this_local;
  
  ConsoleCommand::ConsoleCommand(&this->super_ConsoleCommand);
  *(undefined ***)this = &PTR_getHelp_001249b0;
  local_18 = 0;
  while( true ) {
    lVar1 = Jupiter::Command::getTriggerCount();
    if (local_18 == lVar1) break;
    local_18 = local_18 + 1;
    auVar2 = Jupiter::Command::getTrigger((ulong)&PartGenericCommand_instance);
    Jupiter::Command::addTrigger(this,auVar2._0_8_,auVar2._8_8_);
  }
  return;
}

Assistant:

Generic_Command_As_Console_Command<T>::Generic_Command_As_Console_Command() : ConsoleCommand() {
	size_t index = 0;
	while (index != T::instance.getTriggerCount()) {
		this->addTrigger(T::instance.getTrigger(index++));
	}
}